

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O3

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::
getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind>
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          HeapTypeGeneratorImpl *this,Shareability share)

{
  iterator __position;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *in_RAX;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RAX;
  ulong uVar2;
  ulong uVar3;
  HeapType local_38;
  
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)(ulong)this->index;
  uVar3 = (ulong)(this->recGroupEnds).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pvVar1];
  if (uVar3 != 0) {
    uVar2 = 0;
    local_38.id = (uintptr_t)in_RAX;
    do {
      pvVar1 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               (this->typeKinds).
               super__Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar1 != (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)0x0) &&
         (*(char *)((long)&(pvVar1->
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                           _M_impl.super__Vector_impl_data._M_start + uVar2 * 2 + 1) == '\x01')) {
        local_38.id = wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
        pvVar1 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 wasm::HeapType::getShared();
        if ((Shareability)pvVar1 == share) {
          pvVar1 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          local_38.id = (uintptr_t)pvVar1;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
            _M_realloc_insert<wasm::HeapType>(__return_storage_ptr__,__position,&local_38);
            pvVar1 = extraout_RAX;
          }
          else {
            (__position._M_current)->id = (uintptr_t)pvVar1;
            (__return_storage_ptr__->
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return pvVar1;
}

Assistant:

std::vector<HeapType> getKindCandidates(Shareability share) {
    std::vector<HeapType> candidates;
    // Iterate through the top level kinds, finding matches for `Kind`. Since we
    // are constructing a child, we can only look through the end of the current
    // recursion group.
    for (Index i = 0, end = recGroupEnds[index]; i < end; ++i) {
      if (std::get_if<Kind>(&typeKinds[i]) &&
          share == HeapType(builder[i]).getShared()) {
        candidates.push_back(builder[i]);
      }
    }
    return candidates;
  }